

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_iso9660.c
# Opt level: O0

int iso9660LoadEntries(PHYSFS_Io *io,int joliet,char *base,PHYSFS_uint64 dirstart,
                      PHYSFS_uint64 dirend,void *unpkarc)

{
  byte bVar1;
  int iVar2;
  PHYSFS_uint64 PVar3;
  PHYSFS_uint64 nextpos;
  int multiextent;
  int isdir;
  tm t;
  PHYSFS_sint64 timestamp;
  PHYSFS_uint8 fname [256];
  byte local_69;
  byte local_68;
  undefined1 local_67;
  byte local_66;
  byte local_65;
  byte local_64;
  byte local_63;
  byte local_62;
  PHYSFS_uint8 fnamelen;
  PHYSFS_uint8 flags;
  PHYSFS_uint8 offset;
  PHYSFS_uint8 second;
  PHYSFS_uint8 minute;
  PHYSFS_uint8 hour;
  PHYSFS_uint8 day;
  PHYSFS_uint8 month;
  PHYSFS_uint8 year;
  PHYSFS_uint8 ignore [4];
  PHYSFS_uint32 datalen;
  PHYSFS_uint32 extent;
  PHYSFS_uint8 extattrlen;
  PHYSFS_uint8 recordlen;
  PHYSFS_uint64 readpos;
  void *unpkarc_local;
  PHYSFS_uint64 dirend_local;
  PHYSFS_uint64 dirstart_local;
  char *base_local;
  PHYSFS_Io *pPStack_20;
  int joliet_local;
  PHYSFS_Io *io_local;
  
  PVar3 = dirstart;
  readpos = (PHYSFS_uint64)unpkarc;
  unpkarc_local = (void *)dirend;
  dirend_local = dirstart;
  dirstart_local = (PHYSFS_uint64)base;
  base_local._4_4_ = joliet;
  pPStack_20 = io;
  while( true ) {
    while( true ) {
      _extent = PVar3;
      iVar2 = (*pPStack_20->seek)(pPStack_20,_extent);
      if (iVar2 == 0) {
        return 0;
      }
      iVar2 = __PHYSFS_readAll(pPStack_20,(void *)((long)&datalen + 3),1);
      if (iVar2 == 0) {
        return 0;
      }
      if (datalen._3_1_ != 0) break;
      if ((long)unpkarc_local - 0x800U <= _extent - 1) {
        return 1;
      }
      PVar3 = ((_extent - 1 >> 0xb) + 1) * 0x800;
      if (PVar3 == _extent) {
        PHYSFS_setErrorCode(PHYSFS_ERR_CORRUPT);
        return 0;
      }
    }
    _extent = datalen._3_1_ + _extent;
    iVar2 = __PHYSFS_readAll(pPStack_20,(void *)((long)&datalen + 2),1);
    if (iVar2 == 0) {
      return 0;
    }
    iVar2 = __PHYSFS_readAll(pPStack_20,ignore,4);
    if (iVar2 == 0) {
      return 0;
    }
    iVar2 = __PHYSFS_readAll(pPStack_20,&flags,4);
    if (iVar2 == 0) {
      return 0;
    }
    iVar2 = __PHYSFS_readAll(pPStack_20,&hour,4);
    if (iVar2 == 0) {
      return 0;
    }
    iVar2 = __PHYSFS_readAll(pPStack_20,&flags,4);
    if (iVar2 == 0) {
      return 0;
    }
    iVar2 = __PHYSFS_readAll(pPStack_20,&fnamelen,1);
    if (iVar2 == 0) {
      return 0;
    }
    iVar2 = __PHYSFS_readAll(pPStack_20,&local_62,1);
    if (iVar2 == 0) {
      return 0;
    }
    iVar2 = __PHYSFS_readAll(pPStack_20,&local_63,1);
    if (iVar2 == 0) {
      return 0;
    }
    iVar2 = __PHYSFS_readAll(pPStack_20,&local_64,1);
    if (iVar2 == 0) {
      return 0;
    }
    iVar2 = __PHYSFS_readAll(pPStack_20,&local_65,1);
    if (iVar2 == 0) {
      return 0;
    }
    iVar2 = __PHYSFS_readAll(pPStack_20,&local_66,1);
    if (iVar2 == 0) {
      return 0;
    }
    iVar2 = __PHYSFS_readAll(pPStack_20,&local_67,1);
    if (iVar2 == 0) break;
    iVar2 = __PHYSFS_readAll(pPStack_20,&local_68,1);
    if (iVar2 == 0) {
      return 0;
    }
    bVar1 = local_68 & 2;
    if ((local_68 & 0x80) != 0) {
      PHYSFS_setErrorCode(PHYSFS_ERR_UNSUPPORTED);
      return 0;
    }
    iVar2 = __PHYSFS_readAll(pPStack_20,&flags,1);
    if (iVar2 == 0) {
      return 0;
    }
    iVar2 = __PHYSFS_readAll(pPStack_20,&flags,1);
    if (iVar2 == 0) {
      return 0;
    }
    iVar2 = __PHYSFS_readAll(pPStack_20,&flags,2);
    if (iVar2 == 0) {
      return 0;
    }
    iVar2 = __PHYSFS_readAll(pPStack_20,&flags,2);
    if (iVar2 == 0) {
      return 0;
    }
    iVar2 = __PHYSFS_readAll(pPStack_20,&local_69,1);
    if (iVar2 == 0) {
      return 0;
    }
    iVar2 = __PHYSFS_readAll(pPStack_20,&timestamp,(ulong)local_69);
    if (iVar2 == 0) {
      return 0;
    }
    multiextent = (int)local_66;
    isdir = (int)local_65;
    t.tm_sec = (int)local_64;
    t.tm_min = (int)local_63;
    t.tm_hour = local_62 - 1;
    t.tm_mday = (int)fnamelen;
    t.tm_mon = 0;
    t.tm_year = 0;
    t.tm_wday = -1;
    t.tm_zone = (char *)mktime((tm *)&multiextent);
    ignore = (PHYSFS_uint8  [4])((uint)datalen._2_1_ + (int)ignore);
    if ((uint)((int)ignore * 0x800) == dirend_local) {
      PHYSFS_setErrorCode(PHYSFS_ERR_CORRUPT);
      return 0;
    }
    iVar2 = iso9660AddEntry(pPStack_20,base_local._4_4_,(uint)(bVar1 != 0),(char *)dirstart_local,
                            (PHYSFS_uint8 *)&timestamp,(uint)local_69,(PHYSFS_sint64)t.tm_zone,
                            (ulong)(uint)((int)ignore * 0x800),(ulong)_hour,(void *)readpos);
    PVar3 = _extent;
    if (iVar2 == 0) {
      return 0;
    }
  }
  return 0;
}

Assistant:

static int iso9660LoadEntries(PHYSFS_Io *io, const int joliet,
                              const char *base, const PHYSFS_uint64 dirstart,
                              const PHYSFS_uint64 dirend, void *unpkarc)
{
    PHYSFS_uint64 readpos = dirstart;

    while (1)
    {
        PHYSFS_uint8 recordlen;
        PHYSFS_uint8 extattrlen;
        PHYSFS_uint32 extent;
        PHYSFS_uint32 datalen;
        PHYSFS_uint8 ignore[4];
        PHYSFS_uint8 year, month, day, hour, minute, second, offset;
        PHYSFS_uint8 flags;
        PHYSFS_uint8 fnamelen;
        PHYSFS_uint8 fname[256];
        PHYSFS_sint64 timestamp;
        struct tm t;
        int isdir;
        int multiextent;

        BAIL_IF_ERRPASS(!io->seek(io, readpos), 0);

        /* recordlen = 0 -> no more entries or fill entry */
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &recordlen, 1), 0);
        if (recordlen > 0)
            readpos += recordlen;  /* ready to seek to next record. */
        else
        {
            PHYSFS_uint64 nextpos;

            /* if we are in the last sector of the directory & it's 0 -> end */
            if ((dirend - 2048) <= (readpos - 1))
                break; /* finished */

            /* else skip to the next sector & continue; */
            nextpos = (((readpos - 1) / 2048) + 1) * 2048;

            /* whoops, can't make forward progress! */
            BAIL_IF(nextpos == readpos, PHYSFS_ERR_CORRUPT, 0);

            readpos = nextpos;
            continue;  /* start back at upper loop. */
        } /* else */

        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &extattrlen, 1), 0);
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &extent, 4), 0);
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, ignore, 4), 0); /* extent be */
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &datalen, 4), 0);
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, ignore, 4), 0); /* datalen be */

        /* record timestamp */
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &year, 1), 0);
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &month, 1), 0);
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &day, 1), 0);
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &hour, 1), 0);
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &minute, 1), 0);
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &second, 1), 0);
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &offset, 1), 0);

        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &flags, 1), 0);
        isdir = (flags & (1 << 1)) != 0;
        multiextent = (flags & (1 << 7)) != 0;
        BAIL_IF(multiextent, PHYSFS_ERR_UNSUPPORTED, 0);  /* !!! FIXME */

        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, ignore, 1), 0); /* unit size */
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, ignore, 1), 0); /* interleave gap */
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, ignore, 2), 0); /* seqnum le */
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, ignore, 2), 0); /* seqnum be */
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &fnamelen, 1), 0);
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, fname, fnamelen), 0);

        t.tm_sec = second;
        t.tm_min = minute;
        t.tm_hour = hour;
        t.tm_mday = day;
        t.tm_mon = month - 1;
        t.tm_year = year;
        t.tm_wday = 0;
        t.tm_yday = 0;
        t.tm_isdst = -1;
        timestamp = (PHYSFS_sint64) mktime(&t);

        extent += extattrlen;  /* skip extended attribute record. */

        /* infinite loop, corrupt file? */
        BAIL_IF((extent * 2048) == dirstart, PHYSFS_ERR_CORRUPT, 0);

        if (!iso9660AddEntry(io, joliet, isdir, base, fname, fnamelen,
                             timestamp, extent * 2048, datalen, unpkarc))
        {
            return 0;
        } /* if */
    } /* while */

    return 1;
}